

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

tuple<double,_double>
MatchingMethod(int param_1,void *param_2,string *whichThread,Mat *croppedFrame)

{
  undefined1 auVar1 [16];
  int iVar2;
  bool bVar3;
  _InputArray *p_Var4;
  undefined4 in_register_0000003c;
  void *in_R8;
  undefined1 *puVar5;
  double dVar6;
  undefined1 auVar7 [16];
  _Tuple_impl<1UL,_double> _Var9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  tuple<double,_double> tVar12;
  _InputArray local_140;
  undefined1 local_128 [16];
  undefined1 (*local_110) [16];
  void *local_108;
  undefined8 local_100;
  int local_f8;
  int iStack_f4;
  undefined8 local_f0;
  undefined8 local_e8;
  Point maxLoc;
  Point minLoc;
  undefined8 local_d0;
  double maxVal;
  _InputArray local_c0;
  undefined1 local_a8 [16];
  undefined1 local_98 [80];
  double minVal;
  _InputArray *local_40;
  Size local_38;
  
  local_98._8_8_ = local_98._0_8_;
  local_110 = (undefined1 (*) [16])CONCAT44(in_register_0000003c,param_1);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          croppedFrame,"threadA");
  puVar5 = result_B;
  if (bVar3) {
    puVar5 = result_A;
  }
  cv::Mat::create((int)puVar5,(*(int *)((long)in_R8 + 8) - templ._8_4_) + 1,
                  (*(int *)((long)in_R8 + 0xc) - templ._12_4_) + 1);
  iVar2 = match_method;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_98._8_8_;
  local_98._0_16_ = auVar1 << 0x40;
  local_a8._0_4_ = 0x1010000;
  local_140.sz.width = 0;
  local_140.sz.height = 0;
  local_140.flags = 0x1010000;
  local_c0.sz.width = 0;
  local_c0.sz.height = 0;
  local_140.obj = templ;
  local_c0.flags = 0x2010000;
  local_108 = in_R8;
  local_c0.obj = puVar5;
  p_Var4 = (_InputArray *)cv::noArray();
  cv::matchTemplate((_InputArray *)local_a8,&local_140,(_OutputArray *)&local_c0,iVar2,p_Var4);
  local_140.sz.width = 0;
  local_140.sz.height = 0;
  local_c0.sz.width = 0;
  local_c0.sz.height = 0;
  local_140.flags = 0x1010000;
  local_c0.flags = 0x3010000;
  local_140.obj = puVar5;
  local_c0.obj = puVar5;
  cv::Mat::Mat((Mat *)local_a8);
  local_38.width = 0;
  local_38.height = 0;
  minVal._0_4_ = 0x1010000;
  local_40 = (_InputArray *)local_a8;
  cv::normalize(&local_140,(_InputOutputArray *)&local_c0,0.0,1.0,0x20,-1,(_InputArray *)&minVal);
  cv::Mat::~Mat((Mat *)local_a8);
  minLoc.x = 0;
  minLoc.y = 0;
  maxLoc.x = 0;
  maxLoc.y = 0;
  local_140.sz.width = 0;
  local_140.sz.height = 0;
  local_140.flags = 0x1010000;
  local_140.obj = puVar5;
  cv::Mat::Mat((Mat *)local_a8);
  local_c0.sz.width = 0;
  local_c0.sz.height = 0;
  local_c0.flags = 0x1010000;
  local_c0.obj = (Mat *)local_a8;
  cv::minMaxLoc(&local_140,&minVal,&maxVal,(Point_ *)&minLoc,(Point_ *)&maxLoc,&local_c0);
  cv::Mat::~Mat((Mat *)local_a8);
  auVar10._8_8_ = 0;
  auVar10._0_4_ = maxLoc.x;
  auVar10._4_4_ = maxLoc.y;
  auVar11._0_8_ =
       CONCAT44((int)((uint)((uint)match_method < 2) << 0x1f) >> 0x1f,
                (int)((uint)((uint)match_method < 2) << 0x1f) >> 0x1f);
  auVar11._8_8_ = 0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (ulong)minLoc & auVar11._0_8_;
  local_140.sz.width = 0;
  local_140.sz.height = 0;
  local_128 = ~auVar11 & auVar10 | auVar7;
  local_140.flags = 0x3010000;
  local_140.obj = local_108;
  local_e8 = local_128._0_8_;
  local_f0 = CONCAT44(templ._8_4_ + local_128._4_4_,templ._12_4_ + local_128._0_4_);
  cv::Scalar_<double>::all((Scalar_<double> *)local_a8,0.0);
  cv::rectangle(&local_140,&local_e8,&local_f0,local_a8,2,8,0);
  local_140.sz.width = 0;
  local_140.sz.height = 0;
  local_140.flags = 0x3010000;
  local_f8 = local_128._0_4_;
  iStack_f4 = local_128._4_4_;
  local_100 = CONCAT44(templ._8_4_ + local_128._4_4_,templ._12_4_ + local_128._0_4_);
  local_140.obj = puVar5;
  cv::Scalar_<double>::all((Scalar_<double> *)local_a8,0.0);
  cv::rectangle(&local_140,&local_f8,&local_100,local_a8,2,8,0);
  local_140.sz.width = 0;
  local_140.sz.height = 0;
  local_140.flags = 0x3010000;
  local_140.obj = local_108;
  local_d0 = CONCAT44((int)templ._8_4_ / 2 + local_128._4_4_,(int)templ._12_4_ / 2 + local_128._0_4_
                     );
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_a8);
  local_a8._0_8_ = 0.0;
  local_a8._8_8_ = (void *)0x406fe00000000000;
  local_98._0_16_ = (undefined1  [16])0x0;
  cv::circle(&local_140,&local_d0,0,(Matx<double,_4,_1> *)local_a8,5,8,0);
  tVar12.super__Tuple_impl<0UL,_double,_double>.super__Head_base<0UL,_double,_false>._M_head_impl.
  _0_4_ = templ._8_4_ - ((int)templ._8_4_ >> 0x1f);
  tVar12.super__Tuple_impl<0UL,_double,_double>.super__Head_base<0UL,_double,_false>._M_head_impl.
  _4_4_ = templ._12_4_ - ((int)templ._12_4_ >> 0x1f);
  dVar6 = (double)((int)templ._12_4_ / 2 + local_128._0_4_);
  _Var9.super__Head_base<1UL,_double,_false>._M_head_impl =
       (_Head_base<1UL,_double,_false>)(double)((int)templ._8_4_ / 2 + local_128._4_4_);
  auVar8._8_4_ = SUB84(dVar6,0);
  auVar8._0_8_ = _Var9.super__Head_base<1UL,_double,_false>._M_head_impl;
  auVar8._12_4_ = (int)((ulong)dVar6 >> 0x20);
  *local_110 = auVar8;
  tVar12.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
  super__Head_base<1UL,_double,_false>._M_head_impl =
       _Var9.super__Head_base<1UL,_double,_false>._M_head_impl;
  return (tuple<double,_double>)tVar12.super__Tuple_impl<0UL,_double,_double>;
}

Assistant:

tuple<double, double> MatchingMethod( int, void*, const string& whichThread, Mat croppedFrame) {
    Mat *result_X;
    if(whichThread=="threadA"){
        result_X = &result_A;
    }else{
        result_X = &result_B;
    }

    /// Create the result matrix
    int result_cols =  croppedFrame.cols - templ.cols + 1;
    int result_rows = croppedFrame.rows - templ.rows + 1;

    result_X->create(result_rows, result_cols, CV_32FC1);

    /// Do the Matching and Normalize
    matchTemplate( croppedFrame, templ, *result_X, match_method );
    normalize( *result_X, *result_X, 0, 1, NORM_MINMAX, -1, Mat() );

    /// Localizing the best match with minMaxLoc
    double minVal; double maxVal; Point minLoc; Point maxLoc;
    Point matchLoc;

    minMaxLoc( *result_X, &minVal, &maxVal, &minLoc, &maxLoc, Mat() );

    /// For SQDIFF and SQDIFF_NORMED, the best matches are lower values. For all the other methods, the higher the better
    if( match_method  == TM_SQDIFF || match_method == TM_SQDIFF_NORMED ) {
        matchLoc = minLoc;
    } else {
        matchLoc = maxLoc;
    }

    /// Show me what you got
    rectangle( croppedFrame, matchLoc, Point( matchLoc.x + templ.cols , matchLoc.y + templ.rows ), Scalar::all(0), 2, 8, 0 );
    rectangle( *result_X, matchLoc, Point( matchLoc.x + templ.cols , matchLoc.y + templ.rows ), Scalar::all(0), 2, 8, 0 );
    circle(croppedFrame,Point(matchLoc.x + templ.cols/2, matchLoc.y + templ.rows/2),0,Scalar( 0, 255, 0 ),5);

    /// computing and returning the position
    return std::make_tuple(matchLoc.x + templ.cols/2, matchLoc.y + templ.rows/2);
}